

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonReturn(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  char cVar1;
  char cVar2;
  u32 uVar3;
  JsonNode *pJVar4;
  char *pcVar5;
  int iVar6;
  u32 uVar7;
  u32 uVar8;
  u8 *z;
  uint uVar9;
  code *xDel;
  uint n;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  i64 iVal;
  byte bVar13;
  uint uVar14;
  char *z_00;
  ulong uVar15;
  int iStack_70;
  double r;
  
  switch(pNode->eType) {
  case '\x01':
    iVar6 = 1;
    break;
  case '\x02':
    iVar6 = 0;
    break;
  case '\x03':
    z_00 = (pNode->u).zJContent;
    cVar1 = *z_00;
    lVar10 = 0;
    pcVar5 = z_00 + (cVar1 == '-');
    do {
      cVar2 = *pcVar5;
      if (9 < (byte)(cVar2 - 0x30U)) {
        iVal = -lVar10;
        if (cVar1 != '-') {
          iVal = lVar10;
        }
LAB_001c05d2:
        sqlite3_result_int64(pCtx,iVal);
        return;
      }
      if (0xccccccccccccccb < lVar10) {
        if (((lVar10 != 0xccccccccccccccc) || ((byte)(pcVar5[1] - 0x30U) < 10)) || (cVar2 == '9'))
        goto LAB_001c0344;
        if (cVar2 == '8') {
          if (cVar1 != '-') goto LAB_001c0344;
          iVal = -0x8000000000000000;
          goto LAB_001c05d2;
        }
      }
      lVar10 = lVar10 * 10 + (ulong)(byte)(cVar2 - 0x30U);
      pcVar5 = pcVar5 + 1;
    } while( true );
  case '\x04':
    z_00 = (pNode->u).zJContent;
LAB_001c0344:
    iVar6 = sqlite3Strlen30(z_00);
    sqlite3AtoF(z_00,&r,iVar6,'\x01');
    sqlite3_result_double(pCtx,r);
    return;
  case '\x05':
    if ((pNode->jnFlags & 2) == 0) {
      z = &((pNode->u).pPatch)->jnFlags;
      n = pNode->n - 2;
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    }
    else {
      uVar3 = pNode->n;
      pJVar4 = (pNode->u).pPatch;
      z = (u8 *)sqlite3_malloc(uVar3 + 1);
      if (z == (u8 *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        return;
      }
      uVar15 = 0;
      uVar12 = 1;
      while( true ) {
        iStack_70 = 1;
        n = (uint)uVar15;
        uVar11 = (uint)uVar12;
        if (uVar3 - 1 <= uVar11) break;
        bVar13 = (&pJVar4->eType)[uVar12];
        uVar9 = n;
        if (bVar13 == 0x5c) {
          uVar14 = uVar11 + 1;
          bVar13 = (&pJVar4->jnFlags)[uVar12];
          if (bVar13 == 0x62) {
            bVar13 = 8;
          }
          else if (bVar13 == 0x66) {
            bVar13 = 0xc;
          }
          else if (bVar13 == 0x6e) {
            bVar13 = 10;
          }
          else if (bVar13 == 0x72) {
            bVar13 = 0xd;
          }
          else if (bVar13 == 0x75) {
            uVar7 = jsonHexToInt4((char *)(&pJVar4->eU + uVar12));
            if (uVar7 == 0) break;
            bVar13 = (byte)uVar7;
            uVar14 = uVar11 + 5;
            if (0x7f < uVar7) {
              if (uVar7 < 0x800) {
                uVar9 = n + 1;
                z[uVar15] = (byte)(uVar7 >> 6) | 0xc0;
                iStack_70 = 2;
              }
              else {
                if ((((uVar14 < uVar3 - 6) && ((uVar7 & 0xfc00) == 0xd800)) &&
                    ((&pJVar4->eType)[uVar11 + 6] == '\\')) &&
                   (((&pJVar4->eType)[uVar11 + 7] == 'u' &&
                    (uVar8 = jsonHexToInt4(&pJVar4->field_0x3 + uVar14), (uVar8 & 0xfc00) == 0xdc00)
                    ))) {
                  uVar14 = (uVar7 & 0x3ff) * 0x400;
                  uVar9 = (uVar8 & 0x3ff) + uVar14 + 0x10000;
                  uVar11 = uVar11 + 0xb;
                  z[uVar15] = (byte)(uVar9 >> 0x12) | 0xf0;
                  z[n + 1] = (byte)(uVar9 >> 0xc) & 0x3f | 0x80;
                  z[n + 2] = (byte)((uVar8 & 0x3ff | uVar14) >> 6) & 0x3f | 0x80;
                  bVar13 = (byte)uVar8 & 0x3f | 0x80;
                  iStack_70 = 4;
                  uVar9 = n + 3;
                  goto LAB_001c04b3;
                }
                z[uVar15] = (byte)(uVar7 >> 0xc) | 0xe0;
                uVar9 = n + 2;
                z[n + 1] = (byte)(uVar7 >> 6) & 0x3f | 0x80;
                iStack_70 = 3;
              }
              bVar13 = bVar13 & 0x3f | 0x80;
              uVar11 = uVar14;
              goto LAB_001c04b3;
            }
          }
          else if (bVar13 == 0x74) {
            bVar13 = 9;
          }
          uVar11 = uVar14;
          iStack_70 = 1;
        }
LAB_001c04b3:
        uVar15 = (ulong)(n + iStack_70);
        z[uVar9] = bVar13;
        uVar12 = (ulong)(uVar11 + 1);
      }
      z[uVar15] = '\0';
      xDel = sqlite3_free;
    }
    sqlite3_result_text(pCtx,(char *)z,n,xDel);
    return;
  case '\x06':
  case '\a':
    jsonReturnJson(pNode,pCtx,(sqlite3_value **)0x0);
    return;
  default:
    sqlite3_result_null(pCtx);
    return;
  }
  sqlite3_result_int(pCtx,iVar6);
  return;
}

Assistant:

static void jsonReturn(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      sqlite3_result_null(pCtx);
      break;
    }
    case JSON_TRUE: {
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSON_FALSE: {
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSON_INT: {
      sqlite3_int64 i = 0;
      const char *z;
      assert( pNode->eU==1 );
      z = pNode->u.zJContent;
      if( z[0]=='-' ){ z++; }
      while( z[0]>='0' && z[0]<='9' ){
        unsigned v = *(z++) - '0';
        if( i>=LARGEST_INT64/10 ){
          if( i>LARGEST_INT64/10 ) goto int_as_real;
          if( z[0]>='0' && z[0]<='9' ) goto int_as_real;
          if( v==9 ) goto int_as_real;
          if( v==8 ){
            if( pNode->u.zJContent[0]=='-' ){
              sqlite3_result_int64(pCtx, SMALLEST_INT64);
              goto int_done;
            }else{
              goto int_as_real;
            }
          }
        }
        i = i*10 + v;
      }
      if( pNode->u.zJContent[0]=='-' ){ i = -i; }
      sqlite3_result_int64(pCtx, i);
      int_done:
      break;
      int_as_real: ; /* no break */ deliberate_fall_through
    }
    case JSON_REAL: {
      double r;
#ifdef SQLITE_AMALGAMATION
      const char *z;
      assert( pNode->eU==1 );
      z = pNode->u.zJContent;
      sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
#else
      assert( pNode->eU==1 );
      r = strtod(pNode->u.zJContent, 0);
#endif
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSON_STRING: {
#if 0 /* Never happens because JNODE_RAW is only set by json_set(),
      ** json_insert() and json_replace() and those routines do not
      ** call jsonReturn() */
      if( pNode->jnFlags & JNODE_RAW ){
        assert( pNode->eU==1 );
        sqlite3_result_text(pCtx, pNode->u.zJContent, pNode->n,
                            SQLITE_TRANSIENT);
      }else
#endif
      assert( (pNode->jnFlags & JNODE_RAW)==0 );
      if( (pNode->jnFlags & JNODE_ESCAPE)==0 ){
        /* JSON formatted without any backslash-escapes */
        assert( pNode->eU==1 );
        sqlite3_result_text(pCtx, pNode->u.zJContent+1, pNode->n-2,
                            SQLITE_TRANSIENT);
      }else{
        /* Translate JSON formatted string into raw text */
        u32 i;
        u32 n = pNode->n;
        const char *z;
        char *zOut;
        u32 j;
        assert( pNode->eU==1 );
        z = pNode->u.zJContent;
        zOut = sqlite3_malloc( n+1 );
        if( zOut==0 ){
          sqlite3_result_error_nomem(pCtx);
          break;
        }
        for(i=1, j=0; i<n-1; i++){
          char c = z[i];
          if( c!='\\' ){
            zOut[j++] = c;
          }else{
            c = z[++i];
            if( c=='u' ){
              u32 v = jsonHexToInt4(z+i+1);
              i += 4;
              if( v==0 ) break;
              if( v<=0x7f ){
                zOut[j++] = (char)v;
              }else if( v<=0x7ff ){
                zOut[j++] = (char)(0xc0 | (v>>6));
                zOut[j++] = 0x80 | (v&0x3f);
              }else{
                u32 vlo;
                if( (v&0xfc00)==0xd800
                  && i<n-6
                  && z[i+1]=='\\'
                  && z[i+2]=='u'
                  && ((vlo = jsonHexToInt4(z+i+3))&0xfc00)==0xdc00
                ){
                  /* We have a surrogate pair */
                  v = ((v&0x3ff)<<10) + (vlo&0x3ff) + 0x10000;
                  i += 6;
                  zOut[j++] = 0xf0 | (v>>18);
                  zOut[j++] = 0x80 | ((v>>12)&0x3f);
                  zOut[j++] = 0x80 | ((v>>6)&0x3f);
                  zOut[j++] = 0x80 | (v&0x3f);
                }else{
                  zOut[j++] = 0xe0 | (v>>12);
                  zOut[j++] = 0x80 | ((v>>6)&0x3f);
                  zOut[j++] = 0x80 | (v&0x3f);
                }
              }
            }else{
              if( c=='b' ){
                c = '\b';
              }else if( c=='f' ){
                c = '\f';
              }else if( c=='n' ){
                c = '\n';
              }else if( c=='r' ){
                c = '\r';
              }else if( c=='t' ){
                c = '\t';
              }
              zOut[j++] = c;
            }
          }
        }
        zOut[j] = 0;
        sqlite3_result_text(pCtx, zOut, j, sqlite3_free);
      }
      break;
    }
    case JSON_ARRAY:
    case JSON_OBJECT: {
      jsonReturnJson(pNode, pCtx, aReplace);
      break;
    }
  }
}